

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

size_t __thiscall
google::protobuf::internal::MapFieldBase::SpaceUsedExcludingSelfLong(MapFieldBase *this)

{
  ReflectionPayload *this_00;
  size_t sVar1;
  size_t sVar2;
  MutexLock lock;
  MutexLock local_18;
  
  this_00 = maybe_payload(this);
  if (this_00 != (ReflectionPayload *)0x0) {
    local_18.mu_ = &this_00->mutex;
    absl::lts_20250127::Mutex::Lock(local_18.mu_);
    sVar1 = UntypedMapBase::SpaceUsedExcludingSelfLong((UntypedMapBase *)(this + 1));
    sVar2 = RepeatedPtrFieldBase::
            SpaceUsedExcludingSelfLong<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                      ((RepeatedPtrFieldBase *)this_00);
    absl::lts_20250127::MutexLock::~MutexLock(&local_18);
    return sVar2 + sVar1;
  }
  sVar1 = UntypedMapBase::SpaceUsedExcludingSelfLong((UntypedMapBase *)(this + 1));
  return sVar1;
}

Assistant:

size_t MapFieldBase::SpaceUsedExcludingSelfLong() const {
  ConstAccess();
  size_t size = 0;
  if (auto* p = maybe_payload()) {
    absl::MutexLock lock(&p->mutex);
    // Measure the map under the lock, because there could be some repeated
    // field data that might be sync'd back into the map.
    size = GetMapRaw().SpaceUsedExcludingSelfLong();
    size += p->repeated_field.SpaceUsedExcludingSelfLong();
    ConstAccess();
  } else {
    // Only measure the map without the repeated field, because it is not there.
    size = GetMapRaw().SpaceUsedExcludingSelfLong();
    ConstAccess();
  }
  return size;
}